

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c
# Opt level: O3

void arena_large_malloc_stats_update(tsdn_t *tsdn,arena_t *arena,size_t usize)

{
  cache_bin_stats_t *pcVar1;
  long lVar2;
  uint uVar3;
  arena_t *paVar4;
  ulong uVar5;
  byte bVar6;
  int iVar7;
  
  if (arena < (arena_t *)0x7000000000000001) {
    paVar4 = (arena_t *)0x4000;
    if ((arena_t *)0x4000 < arena) {
      paVar4 = arena;
    }
    uVar5 = (long)paVar4 * 2 - 1;
    lVar2 = 0x3f;
    if (uVar5 != 0) {
      for (; uVar5 >> lVar2 == 0; lVar2 = lVar2 + -1) {
      }
    }
    uVar3 = (uint)lVar2;
    iVar7 = uVar3 - 6;
    if (uVar3 < 6) {
      iVar7 = 0;
    }
    bVar6 = 4;
    if (6 < uVar3) {
      bVar6 = (char)lVar2 - 3;
    }
    uVar3 = (uint)((((ulong)((long)&paVar4[-1].create_time.ns + 7U) >> (bVar6 & 0x3f)) <<
                   (bVar6 & 0x3f)) >> (bVar6 & 0x3f)) & 3;
    uVar5 = (ulong)((uVar3 - 0x23) + iVar7 * 4);
    if (uVar3 + iVar7 * 4 + 1 < 0x24) {
      uVar5 = 0;
    }
  }
  else {
    uVar5 = 0xc4;
  }
  LOCK();
  pcVar1 = &(tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_tcache.bins_small
            [uVar5 * 2 + 10].tstats;
  pcVar1->nrequests = pcVar1->nrequests + 1;
  UNLOCK();
  return;
}

Assistant:

static void
arena_large_malloc_stats_update(tsdn_t *tsdn, arena_t *arena, size_t usize) {
	szind_t index, hindex;

	cassert(config_stats);

	if (usize < SC_LARGE_MINCLASS) {
		usize = SC_LARGE_MINCLASS;
	}
	index = sz_size2index(usize);
	hindex = (index >= SC_NBINS) ? index - SC_NBINS : 0;

	arena_stats_add_u64(tsdn, &arena->stats,
	    &arena->stats.lstats[hindex].nmalloc, 1);
}